

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_markable.cpp
# Opt level: O1

void test_dual_storage_with_tuple_init_state_mutation(void)

{
  union_type local_28;
  opt_interval o2;
  opt_interval o1;
  
  DateInterval_move_ctor_calls_count = 0;
  DateInterval_dtor_calls_count = 0;
  DateInterval_value_ctor_calls_count = 1;
  o2._storage.value_ = (storage_type)(union_type)0x100000002;
  local_28 = (union_type)0x200000001;
  o1._storage.value_ = (storage_type)(union_type)0x200000001;
  DateInterval_copy_ctor_calls_count = 2;
  ak_toolkit::markable_ns::dual_storage<mark_interval>::operator=(&o2._storage,&o1._storage);
  if ((int)o1._storage.value_._value._first._d <= (int)o1._storage.value_._value._last._d) {
    DateInterval_dtor_calls_count = DateInterval_dtor_calls_count + 1;
  }
  if ((((DateInterval_value_ctor_calls_count != 1) || (DateInterval_copy_ctor_calls_count != 2)) ||
      (DateInterval_move_ctor_calls_count != 1)) || (DateInterval_dtor_calls_count != 1)) {
    __assert_fail("count_Interval_value_copy_move_dtror(1, 2, 1, 1)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x39d,"void test_dual_storage_with_tuple_init_state_mutation()");
  }
  o1._storage.value_ = (storage_type)(union_type)0x100000002;
  ak_toolkit::markable_ns::dual_storage<mark_interval>::operator=
            ((dual_storage<mark_interval> *)&local_28._value,&o1._storage);
  if ((int)o1._storage.value_._value._first._d <= (int)o1._storage.value_._value._last._d) {
    DateInterval_dtor_calls_count = DateInterval_dtor_calls_count + 1;
  }
  if (((DateInterval_value_ctor_calls_count != 1) || (DateInterval_copy_ctor_calls_count != 2)) ||
     ((DateInterval_move_ctor_calls_count != 1 || (DateInterval_dtor_calls_count != 2)))) {
    __assert_fail("count_Interval_value_copy_move_dtror(1, 2, 1, 2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x39f,"void test_dual_storage_with_tuple_init_state_mutation()");
  }
  if ((int)o2._storage.value_._value._last._d < (int)o2._storage.value_._value._first._d) {
    __assert_fail("o1.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x3a1,"void test_dual_storage_with_tuple_init_state_mutation()");
  }
  if ((o2._storage.value_._value._last._d != 2) || (o2._storage.value_._value._first._d != 1)) {
    __assert_fail("o1.value() == i12",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x3a2,"void test_dual_storage_with_tuple_init_state_mutation()");
  }
  if ((int)local_28._value._first._d <= (int)local_28._value._last._d) {
    __assert_fail("!o2.has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x3a3,"void test_dual_storage_with_tuple_init_state_mutation()");
  }
  ak_toolkit::markable_ns::dual_storage<mark_interval>::swap_impl
            (&o2._storage,(dual_storage<mark_interval> *)&local_28._value);
  if ((DateInterval_move_ctor_calls_count == 2 &&
       (DateInterval_copy_ctor_calls_count == 2 && DateInterval_value_ctor_calls_count == 1)) &&
     (DateInterval_dtor_calls_count == 3)) {
    if ((int)o2._storage.value_._value._first._d <= (int)o2._storage.value_._value._last._d) {
      __assert_fail("!o1.has_value()",
                    "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                    ,0x3a8,"void test_dual_storage_with_tuple_init_state_mutation()");
    }
    if ((int)local_28._value._last._d < (int)local_28._value._first._d) {
      __assert_fail("o2.has_value()",
                    "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                    ,0x3a9,"void test_dual_storage_with_tuple_init_state_mutation()");
    }
    if ((local_28._value._last._d != 2) || (local_28._value._first._d != 1)) {
      __assert_fail("o2.value() == i12",
                    "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                    ,0x3aa,"void test_dual_storage_with_tuple_init_state_mutation()");
    }
    DateInterval_dtor_calls_count = 4;
    if ((int)o2._storage.value_._value._first._d <= (int)o2._storage.value_._value._last._d) {
      DateInterval_dtor_calls_count = 5;
    }
    DateInterval_dtor_calls_count = DateInterval_dtor_calls_count + 1;
    if ((DateInterval_move_ctor_calls_count != 2 ||
        (DateInterval_copy_ctor_calls_count != 2 || DateInterval_value_ctor_calls_count != 1)) ||
        DateInterval_dtor_calls_count != 5) {
      __assert_fail("count_Interval_value_copy_move_dtror(1, 2, 2, 5)",
                    "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                    ,0x3ac,"void test_dual_storage_with_tuple_init_state_mutation()");
    }
    return;
  }
  __assert_fail("count_Interval_value_copy_move_dtror(1, 2, 2, 3)",
                "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                ,0x3a6,"void test_dual_storage_with_tuple_init_state_mutation()");
}

Assistant:

void test_dual_storage_with_tuple_init_state_mutation()
{
  reset_Interval_count();
  {
    typedef markable<mark_interval> opt_interval;
    DateInterval i12 {Date{1}, Date{2}};
    assert (count_Interval_value_copy_move_dtror(1, 0, 0, 0));

    opt_interval o1 {}, o2 {i12};
    assert (count_Interval_value_copy_move_dtror(1, 1, 0, 0));

    assert (!o1.has_value());
    assert (o2.has_value());

    o1 = opt_interval{i12};
    assert (count_Interval_value_copy_move_dtror(1, 2, 1, 1));
    o2 = {};
    assert (count_Interval_value_copy_move_dtror(1, 2, 1, 2));

    assert (o1.has_value());
    assert (o1.value() == i12);
    assert (!o2.has_value());

    swap (o1, o2);
    assert (count_Interval_value_copy_move_dtror(1, 2, 2, 3));

    assert (!o1.has_value());
    assert (o2.has_value());
    assert (o2.value() == i12);
  }
  assert (count_Interval_value_copy_move_dtror(1, 2, 2, 5));
}